

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

ComponentHandle<Tag,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Tag,Tag_const&>(EntityManager *this,Id id,Tag *args)

{
  ulong *puVar1;
  long lVar2;
  pointer pcVar3;
  ComponentHandle<Tag,_entityx::EntityManager> CVar4;
  Family FVar5;
  Pool<Tag,_8192UL> *pPVar6;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  ComponentHandle<Tag,_entityx::EntityManager> component;
  Entity local_48;
  ComponentHandle<Tag,_entityx::EntityManager> local_38;
  
  FVar5 = Component<Tag>::family();
  pPVar6 = accomodate_component<Tag>(this);
  uVar9 = id.id_ & 0xffffffff;
  lVar2 = *(long *)(*(long *)&pPVar6->field_0x8 + (uVar9 / *(ulong *)&pPVar6->field_0x28) * 8);
  lVar8 = (uVar9 % *(ulong *)&pPVar6->field_0x28) * *(long *)&pPVar6->field_0x20;
  plVar7 = (long *)(lVar2 + lVar8);
  *plVar7 = (long)(plVar7 + 2);
  pcVar3 = (args->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(lVar2 + lVar8),pcVar3,pcVar3 + (args->tag)._M_string_length);
  if (FVar5 < 0x40) {
    puVar1 = (ulong *)(*(long *)(this + 0x48) + uVar9 * 8);
    *puVar1 = *puVar1 | 1L << ((byte)FVar5 & 0x3f);
    local_48.manager_ = this;
    local_48.id_.id_ = id.id_;
    local_38.manager_ = this;
    local_38.id_.id_ = id.id_;
    EventManager::
    emit<entityx::ComponentAddedEvent<Tag>,entityx::Entity,entityx::ComponentHandle<Tag,entityx::EntityManager>&>
              (*(EventManager **)(this + 0x10),&local_48,&local_38);
    CVar4.id_.id_ = local_38.id_.id_;
    CVar4.manager_ = local_38.manager_;
    return CVar4;
  }
  std::__throw_out_of_range_fmt
            ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",FVar5,0x40);
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }